

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetField<unsigned_int>
          (Reflection *this,Message *message,FieldDescriptor *field,uint *value)

{
  uint uVar1;
  bool bVar2;
  OneofDescriptor *pOVar3;
  uint *puVar4;
  Reflection *in_RCX;
  FieldDescriptor *in_RDX;
  Reflection *in_RSI;
  Message *in_RDI;
  OneofDescriptor *unaff_retaddr;
  Message *in_stack_00000008;
  Reflection *in_stack_00000010;
  FieldDescriptor *in_stack_00000040;
  Message *in_stack_00000048;
  Reflection *in_stack_00000050;
  Reflection *in_stack_ffffffffffffffd0;
  Reflection *this_00;
  
  pOVar3 = FieldDescriptor::containing_oneof(in_RDX);
  this_00 = in_RSI;
  if (pOVar3 != (OneofDescriptor *)0x0) {
    bVar2 = HasOneofField(in_RSI,(Message *)in_RDX,(FieldDescriptor *)in_RCX);
    this_00 = in_RSI;
    if (!bVar2) {
      FieldDescriptor::containing_oneof(in_RDX);
      ClearOneof(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      in_stack_ffffffffffffffd0 = in_RSI;
    }
  }
  uVar1 = *(uint *)&in_RCX->descriptor_;
  puVar4 = MutableRaw<unsigned_int>(in_RCX,in_RDI,(FieldDescriptor *)in_stack_ffffffffffffffd0);
  *puVar4 = uVar1;
  pOVar3 = FieldDescriptor::containing_oneof(in_RDX);
  if (pOVar3 == (OneofDescriptor *)0x0) {
    SetBit(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  }
  else {
    SetOneofCase(this_00,(Message *)in_RDX,(FieldDescriptor *)in_RCX);
  }
  return;
}

Assistant:

void Reflection::SetField(Message* message, const FieldDescriptor* field,
                          const Type& value) const {
  if (field->containing_oneof() && !HasOneofField(*message, field)) {
    ClearOneof(message, field->containing_oneof());
  }
  *MutableRaw<Type>(message, field) = value;
  field->containing_oneof() ? SetOneofCase(message, field)
                            : SetBit(message, field);
}